

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O1

void testBufferCompression(string *tempdir)

{
  int iVar1;
  ulong uVar2;
  ostream *poVar3;
  size_type __new_size;
  size_t sVar4;
  undefined8 extraout_RAX;
  char *in_RCX;
  uint line;
  uint extraout_EDX;
  uint line_00;
  uint line_01;
  uint line_02;
  int unaff_EBP;
  char *__s;
  undefined1 auVar5 [12];
  size_t outsz;
  vector<char,_std::allocator<char>_> buf;
  vector<char,_std::allocator<char>_> cbuf;
  undefined4 local_60;
  undefined2 uStack_5c;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  char *local_58;
  long lStack_50;
  long local_48;
  vector<char,_std::allocator<char>_> local_38;
  
  uVar2 = exr_compress_max_buffer_size(0);
  auVar5 = exr_compress_max_buffer_size(0x80);
  line_00 = auVar5._8_4_;
  if (uVar2 < 9) {
    core_test_fail("bc0 < 9",(char *)0x16,line_00,in_RCX);
    line_00 = extraout_EDX;
LAB_0010b7e3:
    core_test_fail("bc0 < 9",(char *)0x17,line_00,in_RCX);
LAB_0010b7f4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,unaff_EBP);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    __s = (char *)exr_get_default_error_message(unaff_EBP);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
LAB_0010b8da:
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_compress_buffer ( nullptr, 9, buf.data (), buf.size (), &cbuf[0], cbuf.size (), &outsz)"
                   ,(char *)0x20,line_01,in_RCX);
  }
  else {
    if (auVar5._0_8_ < 0x89) goto LAB_0010b7e3;
    __s = (char *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Max Buffer Size (0): ",0x15);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Max Buffer Size (128): ",0x17);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    local_48 = 0;
    local_58 = (char *)0x0;
    lStack_50 = 0;
    local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_60 = 0x6e65704f;
    uStack_5c = 0x5845;
    uStack_5a = 0x52;
    std::vector<char,std::allocator<char>>::_M_assign_aux<char_const*>
              ((vector<char,std::allocator<char>> *)&local_58,&local_60);
    __new_size = exr_compress_max_buffer_size(lStack_50 - (long)local_58);
    std::vector<char,_std::allocator<char>_>::resize(&local_38,__new_size);
    in_RCX = (char *)(lStack_50 - (long)local_58);
    unaff_EBP = exr_compress_buffer(0,9);
    if (unaff_EBP != 0) goto LAB_0010b7f4;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"compressed size: ",0x11);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    in_RCX = local_58;
    iVar1 = exr_uncompress_buffer
                      (0,local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                       CONCAT17(uStack_59,CONCAT16(uStack_5a,CONCAT24(uStack_5c,local_60))),local_58
                       ,lStack_50 - (long)local_58);
    if (iVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"uncompressed size: ",0x13);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (*local_58 == 'O') {
        if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_58 != (char *)0x0) {
          operator_delete(local_58,local_48 - (long)local_58);
        }
        return;
      }
      core_test_fail("buf[0] != \'O\'",(char *)0x25,line,in_RCX);
      goto LAB_0010b8da;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    __s = (char *)exr_get_default_error_message(iVar1);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0010b93e;
    }
  }
  sVar4 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
LAB_0010b93e:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  core_test_fail("exr_uncompress_buffer ( nullptr, cbuf.data (), outsz, &buf[0], buf.size (), &outsz)"
                 ,(char *)0x23,line_02,in_RCX);
  if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58 != (char *)0x0) {
    operator_delete(local_58,local_48 - (long)local_58);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testBufferCompression (const std::string& tempdir)
{
    size_t bc0   = exr_compress_max_buffer_size (0);
    size_t bc128 = exr_compress_max_buffer_size (128);
    if (bc0 < 9) EXRCORE_TEST_FAIL (bc0 < 9);
    if (bc128 < 128 + 9) EXRCORE_TEST_FAIL (bc0 < 9);
    std::cout << "Max Buffer Size (0): " << bc0 << std::endl;
    std::cout << "Max Buffer Size (128): " << bc128 << std::endl;

    std::vector<char> buf, cbuf;
    buf = {'O', 'p', 'e', 'n', 'E', 'X', 'R'};
    cbuf.resize (exr_compress_max_buffer_size (buf.size ()));
    size_t outsz;
    EXRCORE_TEST_RVAL (exr_compress_buffer (
        nullptr, 9, buf.data (), buf.size (), &cbuf[0], cbuf.size (), &outsz));
    std::cout << "compressed size: " << outsz << std::endl;
    EXRCORE_TEST_RVAL (exr_uncompress_buffer (
        nullptr, cbuf.data (), outsz, &buf[0], buf.size (), &outsz));
    std::cout << "uncompressed size: " << outsz << std::endl;
    if (buf[0] != 'O') EXRCORE_TEST_FAIL (buf[0] != 'O');
}